

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VmaSuballocation *
VmaBinaryFindFirstNotLess<VmaSuballocationOffsetGreater,VmaSuballocation_const*,VmaSuballocation>
          (VmaSuballocation *beg,VmaSuballocation *end,VmaSuballocation *key,
          VmaSuballocationOffsetGreater *cmp)

{
  bool bVar1;
  ulong uVar2;
  VmaSuballocationOffsetGreater *in_RCX;
  VmaSuballocation *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t mid;
  size_t up;
  size_t down;
  undefined8 local_30;
  undefined8 local_28;
  
  local_28 = 0;
  uVar2 = in_RSI - in_RDI >> 5;
  while (local_30 = uVar2, local_28 < local_30) {
    uVar2 = local_28 + (local_30 - local_28 >> 1);
    bVar1 = VmaSuballocationOffsetGreater::operator()
                      (in_RCX,(VmaSuballocation *)(in_RDI + uVar2 * 0x20),in_RDX);
    if (bVar1) {
      local_28 = uVar2 + 1;
      uVar2 = local_30;
    }
  }
  return (VmaSuballocation *)(in_RDI + local_28 * 0x20);
}

Assistant:

static IterT VmaBinaryFindFirstNotLess(IterT beg, IterT end, const KeyT& key, const CmpLess& cmp)
{
    size_t down = 0, up = (end - beg);
    while (down < up)
    {
        const size_t mid = down + (up - down) / 2;  // Overflow-safe midpoint calculation
        if (cmp(*(beg + mid), key))
        {
            down = mid + 1;
        }
        else
        {
            up = mid;
        }
    }
    return beg + down;
}